

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxVariant.h
# Opt level: O2

bool Jinx::ValidateValueComparison(Variant *left,Variant *right)

{
  ValueType VVar1;
  ValueType VVar2;
  
  VVar1 = left->m_type;
  if (((Impl::VarCmpTable::allowValueCompare[(int)VVar1] == true) &&
      (VVar2 = right->m_type, Impl::VarCmpTable::allowValueCompare[(int)VVar2] == true)) &&
     ((VVar1 == VVar2 || ((VVar2 - Number | VVar1 - Number) < 2)))) {
    return true;
  }
  return false;
}

Assistant:

ValueType GetType() const { return m_type; }